

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts_cache.hpp
# Opt level: O0

void mcts::MCTS_cache_<uttt::IBoard,uttt::RandomPlayout>
               (unordered_set<mcts::GameData<uttt::IBoard>_*,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
                *cache,GameData<uttt::IBoard> *root_game_data)

{
  double dVar1;
  __type _Var2;
  initializer_list<mcts::GameData<uttt::IBoard>_*> __l;
  bool bVar3;
  int iVar4;
  reference ppVar5;
  reference ppGVar6;
  ulong uVar7;
  size_type sVar8;
  reference plVar9;
  void *pvVar10;
  mapped_type *pmVar11;
  reference ppVar12;
  _Node_iterator_base<mcts::GameData<uttt::IBoard>_*,_true> game;
  reference ppGVar13;
  IBoard *pIVar14;
  GameData<uttt::IBoard> *in_RSI;
  pair<std::__detail::_Node_iterator<mcts::GameData<uttt::IBoard>_*,_true,_true>,_bool> pVar15;
  uint i_1;
  int status_1;
  iterator it_1;
  GameData<uttt::IBoard> *new_node;
  pair<mcts::GameData<uttt::IBoard>_*const,_long> p_1;
  iterator __end0_2;
  iterator __begin0_2;
  unordered_map<mcts::GameData<uttt::IBoard>_*,_long,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>_>_>
  *__range2_1;
  GameData<uttt::IBoard> *new_game_data;
  long m;
  iterator __end0_1;
  iterator __begin0_1;
  vector<long,_std::allocator<long>_> *__range2;
  unordered_map<mcts::GameData<uttt::IBoard>_*,_long,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>_>_>
  positions;
  vector<long,_std::allocator<long>_> moves;
  uint i;
  int status;
  IPlayer player;
  double p;
  GameData<uttt::IBoard> *n;
  pair<long,_mcts::GameData<uttt::IBoard>_*> it;
  iterator __end0;
  iterator __begin0;
  vector<std::pair<long,_mcts::GameData<uttt::IBoard>_*>,_std::allocator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_>_>
  *__range3;
  double min;
  GameData<uttt::IBoard> *child;
  vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_> nodes;
  GameData<uttt::IBoard> *node;
  IPlayer player_to_move;
  IBoard *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  GameData<uttt::IBoard> *in_stack_fffffffffffffde8;
  GameData<uttt::IBoard> *pGVar16;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  allocator_type *in_stack_fffffffffffffe08;
  long lVar17;
  vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
  *in_stack_fffffffffffffe10;
  iterator in_stack_fffffffffffffe18;
  size_type in_stack_fffffffffffffe20;
  uint local_1ac;
  _Node_iterator_base<mcts::GameData<uttt::IBoard>_*,_true> local_190;
  GameData<uttt::IBoard> *this;
  _Node_iterator_base<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>,_true> local_160;
  _Node_iterator_base<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>,_true> local_158;
  undefined1 *local_150;
  _Node_iterator_base<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>,_true> local_148;
  _Node_iterator_base<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>,_true> local_140;
  void *local_138;
  long local_130;
  long *local_128;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_120;
  undefined1 *local_118;
  undefined1 local_110 [56];
  undefined1 local_d8 [24];
  undefined4 local_c0;
  uint local_bc;
  int local_b8;
  IPlayer local_b1;
  double local_b0;
  GameData<uttt::IBoard> *local_a8;
  long local_a0;
  GameData<uttt::IBoard> *local_98;
  pair<long,_mcts::GameData<uttt::IBoard>_*> *local_90;
  __normal_iterator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_*,_std::vector<std::pair<long,_mcts::GameData<uttt::IBoard>_*>,_std::allocator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_>_>_>
  local_88;
  vector<std::pair<long,_mcts::GameData<uttt::IBoard>_*>,_std::allocator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_>_>
  *local_80;
  double local_78;
  GameData<uttt::IBoard> *local_70;
  undefined1 local_51;
  GameData<uttt::IBoard> *local_50;
  GameData<uttt::IBoard> **local_48;
  undefined8 local_40;
  vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_> local_38;
  GameData<uttt::IBoard> *local_20;
  IPlayer local_11;
  GameData<uttt::IBoard> *local_10;
  
  local_10 = in_RSI;
  local_11 = uttt::IBoard::GetPlayerToMove(&in_RSI->game);
  local_20 = local_10;
  local_50 = local_10;
  local_48 = &local_50;
  local_40 = 1;
  pIVar14 = (IBoard *)&local_51;
  std::allocator<mcts::GameData<uttt::IBoard>_*>::allocator
            ((allocator<mcts::GameData<uttt::IBoard>_*> *)0x1f1719);
  __l._M_len = in_stack_fffffffffffffe20;
  __l._M_array = in_stack_fffffffffffffe18;
  std::vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>::
  vector(in_stack_fffffffffffffe10,__l,in_stack_fffffffffffffe08);
  std::allocator<mcts::GameData<uttt::IBoard>_*>::~allocator
            ((allocator<mcts::GameData<uttt::IBoard>_*> *)0x1f174a);
  while (bVar3 = std::
                 vector<std::pair<long,_mcts::GameData<uttt::IBoard>_*>,_std::allocator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_>_>
                 ::empty((vector<std::pair<long,_mcts::GameData<uttt::IBoard>_*>,_std::allocator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_>_>
                          *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0)),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    local_70 = (GameData<uttt::IBoard> *)0x0;
    local_78 = 0.0;
    local_80 = &local_20->children;
    local_88._M_current =
         (pair<long,_mcts::GameData<uttt::IBoard>_*> *)
         std::
         vector<std::pair<long,_mcts::GameData<uttt::IBoard>_*>,_std::allocator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_>_>
         ::begin((vector<std::pair<long,_mcts::GameData<uttt::IBoard>_*>,_std::allocator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_>_>
                  *)in_stack_fffffffffffffdd8);
    local_90 = (pair<long,_mcts::GameData<uttt::IBoard>_*> *)
               std::
               vector<std::pair<long,_mcts::GameData<uttt::IBoard>_*>,_std::allocator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_>_>
               ::end((vector<std::pair<long,_mcts::GameData<uttt::IBoard>_*>,_std::allocator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_>_>
                      *)in_stack_fffffffffffffdd8);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_*,_std::vector<std::pair<long,_mcts::GameData<uttt::IBoard>_*>,_std::allocator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                              (__normal_iterator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_*,_std::vector<std::pair<long,_mcts::GameData<uttt::IBoard>_*>,_std::allocator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_>_>_>
                               *)in_stack_fffffffffffffdd8), bVar3) {
      ppVar5 = __gnu_cxx::
               __normal_iterator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_*,_std::vector<std::pair<long,_mcts::GameData<uttt::IBoard>_*>,_std::allocator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_>_>_>
               ::operator*(&local_88);
      local_a0 = ppVar5->first;
      local_a8 = ppVar5->second;
      dVar1 = local_a8->value;
      lVar17 = local_a8->total;
      local_98 = local_a8;
      _Var2 = std::log<long_long>(0x1f1844);
      local_b0 = sqrt((_Var2 * 2.0) / (double)local_a8->total);
      local_b0 = dVar1 / (double)lVar17 + local_b0;
      if ((local_78 < local_b0) || (local_70 == (GameData<uttt::IBoard> *)0x0)) {
        local_70 = local_98;
        local_78 = local_b0;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_*,_std::vector<std::pair<long,_mcts::GameData<uttt::IBoard>_*>,_std::allocator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_>_>_>
      ::operator++(&local_88);
    }
    local_20 = local_70;
    std::vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>::
    push_back((vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
               *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
              (value_type *)in_stack_fffffffffffffde8);
  }
  local_b1 = local_11;
  local_b8 = uttt::IBoard::GetStatus(&local_20->game);
  if (local_b8 == -1) {
    uttt::IBoard::GetPossibleMoves(pIVar14);
    std::
    unordered_map<mcts::GameData<uttt::IBoard>_*,_long,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>_>_>
    ::unordered_map((unordered_map<mcts::GameData<uttt::IBoard>_*,_long,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>_>_>
                     *)0x1f1acd);
    local_118 = local_d8;
    local_120._M_current =
         (long *)std::vector<long,_std::allocator<long>_>::begin
                           ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdd8);
    local_128 = (long *)std::vector<long,_std::allocator<long>_>::end
                                  ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdd8)
    ;
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                              (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)in_stack_fffffffffffffdd8), bVar3) {
      plVar9 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator*(&local_120);
      local_130 = *plVar9;
      pvVar10 = operator_new(0x40);
      GameData<uttt::IBoard>::GameData
                ((GameData<uttt::IBoard> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 in_stack_fffffffffffffdd8);
      local_138 = pvVar10;
      uttt::IBoard::ApplyMove
                ((IBoard *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                 (IMove *)in_stack_fffffffffffffde8);
      local_140._M_cur =
           (__node_type *)
           std::
           unordered_map<mcts::GameData<uttt::IBoard>_*,_long,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>_>_>
           ::find((unordered_map<mcts::GameData<uttt::IBoard>_*,_long,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>_>_>
                   *)in_stack_fffffffffffffdd8,(key_type *)0x1f1b9b);
      local_148._M_cur =
           (__node_type *)
           std::
           unordered_map<mcts::GameData<uttt::IBoard>_*,_long,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>_>_>
           ::end((unordered_map<mcts::GameData<uttt::IBoard>_*,_long,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>_>_>
                  *)in_stack_fffffffffffffdd8);
      bVar3 = std::__detail::operator!=(&local_140,&local_148);
      if (bVar3) {
        if (local_138 != (void *)0x0) {
          pvVar10 = local_138;
          GameData<uttt::IBoard>::~GameData((GameData<uttt::IBoard> *)0x1f1bfc);
          operator_delete(pvVar10);
        }
      }
      else {
        lVar17 = local_130;
        pmVar11 = std::
                  unordered_map<mcts::GameData<uttt::IBoard>_*,_long,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>_>_>
                  ::operator[]((unordered_map<mcts::GameData<uttt::IBoard>_*,_long,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>_>_>
                                *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                               (key_type *)in_stack_fffffffffffffdd8);
        *pmVar11 = lVar17;
      }
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                (&local_120);
    }
    local_150 = local_110;
    local_158._M_cur =
         (__node_type *)
         std::
         unordered_map<mcts::GameData<uttt::IBoard>_*,_long,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>_>_>
         ::begin((unordered_map<mcts::GameData<uttt::IBoard>_*,_long,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>_>_>
                  *)in_stack_fffffffffffffdd8);
    local_160._M_cur =
         (__node_type *)
         std::
         unordered_map<mcts::GameData<uttt::IBoard>_*,_long,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>_>_>
         ::end((unordered_map<mcts::GameData<uttt::IBoard>_*,_long,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>_>_>
                *)in_stack_fffffffffffffdd8);
    while (bVar3 = std::__detail::operator!=(&local_158,&local_160), bVar3) {
      ppVar12 = std::__detail::
                _Node_iterator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>,_false,_true>::
                operator*((_Node_iterator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>,_false,_true>
                           *)0x1f1cf1);
      pGVar16 = ppVar12->first;
      game._M_cur = (__node_type *)
                    std::
                    unordered_set<mcts::GameData<uttt::IBoard>_*,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
                    ::find((unordered_set<mcts::GameData<uttt::IBoard>_*,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
                            *)in_stack_fffffffffffffdd8,(key_type *)0x1f1d1d);
      local_190._M_cur =
           (__node_type *)
           std::
           unordered_set<mcts::GameData<uttt::IBoard>_*,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
           ::end((unordered_set<mcts::GameData<uttt::IBoard>_*,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
                  *)in_stack_fffffffffffffdd8);
      bVar3 = std::__detail::operator==
                        ((_Node_iterator_base<mcts::GameData<uttt::IBoard>_*,_true> *)
                         &stack0xfffffffffffffe78,&local_190);
      if (bVar3) {
        pVar15 = std::
                 unordered_set<mcts::GameData<uttt::IBoard>_*,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
                 ::insert((unordered_set<mcts::GameData<uttt::IBoard>_*,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
                           *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                          (value_type *)in_stack_fffffffffffffde8);
        in_stack_fffffffffffffdf7 = pVar15.second;
        this = pGVar16;
      }
      else {
        ppGVar13 = std::__detail::_Node_iterator<mcts::GameData<uttt::IBoard>_*,_true,_true>::
                   operator*((_Node_iterator<mcts::GameData<uttt::IBoard>_*,_true,_true> *)0x1f1db8)
        ;
        this = *ppGVar13;
        in_stack_fffffffffffffde8 = pGVar16;
        if (pGVar16 != (GameData<uttt::IBoard> *)0x0) {
          GameData<uttt::IBoard>::~GameData((GameData<uttt::IBoard> *)0x1f1de0);
          operator_delete(pGVar16);
          in_stack_fffffffffffffde8 = pGVar16;
        }
      }
      std::
      vector<std::pair<long,mcts::GameData<uttt::IBoard>*>,std::allocator<std::pair<long,mcts::GameData<uttt::IBoard>*>>>
      ::emplace_back<long&,mcts::GameData<uttt::IBoard>*&>
                ((vector<std::pair<long,_mcts::GameData<uttt::IBoard>_*>,_std::allocator<std::pair<long,_mcts::GameData<uttt::IBoard>_*>_>_>
                  *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                 (long *)in_stack_fffffffffffffde8,
                 (GameData<uttt::IBoard> **)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      std::vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>::
      push_back((vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
                 *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                (value_type *)in_stack_fffffffffffffde8);
      iVar4 = uttt::RandomPlayout::operator()((RandomPlayout *)this,(IBoard *)game._M_cur);
      local_b1 = local_11;
      in_stack_fffffffffffffde4 = iVar4;
      ppGVar6 = std::
                vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
                ::operator[](&local_38,0);
      (*ppGVar6)->total = (*ppGVar6)->total + 1;
      local_1ac = 1;
      while( true ) {
        in_stack_fffffffffffffdd8 = (IBoard *)(ulong)local_1ac;
        pIVar14 = (IBoard *)
                  std::
                  vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
                  ::size(&local_38);
        if (pIVar14 <= in_stack_fffffffffffffdd8) break;
        ppGVar6 = std::
                  vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
                  ::operator[](&local_38,(ulong)local_1ac);
        (*ppGVar6)->total = (*ppGVar6)->total + 1;
        if (local_b1 == iVar4) {
          ppGVar6 = std::
                    vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
                    ::operator[](&local_38,(ulong)local_1ac);
          (*ppGVar6)->value = (*ppGVar6)->value + 1.0;
        }
        else if (iVar4 == 0) {
          ppGVar6 = std::
                    vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
                    ::operator[](&local_38,(ulong)local_1ac);
          (*ppGVar6)->value = (*ppGVar6)->value + 0.5;
        }
        local_1ac = local_1ac + 1;
        local_b1 = '\x03' - local_b1;
      }
      std::vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>::
      pop_back((vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
                *)0x1f1f6d);
      std::__detail::
      _Node_iterator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>,_false,_true>::operator++
                ((_Node_iterator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>,_false,_true>
                  *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    }
    std::
    unordered_map<mcts::GameData<uttt::IBoard>_*,_long,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>_>_>
    ::~unordered_map((unordered_map<mcts::GameData<uttt::IBoard>_*,_long,_mcts::GameDataHash<uttt::IBoard>,_mcts::GameDataEqual<uttt::IBoard>,_std::allocator<std::pair<mcts::GameData<uttt::IBoard>_*const,_long>_>_>
                      *)0x1f1f8c);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)
               CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    local_c0 = 0;
  }
  else {
    ppGVar6 = std::
              vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
              ::operator[](&local_38,0);
    (*ppGVar6)->total = (*ppGVar6)->total + 1;
    for (local_bc = 1; uVar7 = (ulong)local_bc,
        sVar8 = std::
                vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
                ::size(&local_38), uVar7 < sVar8; local_bc = local_bc + 1) {
      ppGVar6 = std::
                vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
                ::operator[](&local_38,(ulong)local_bc);
      (*ppGVar6)->total = (*ppGVar6)->total + 1;
      if (local_b1 == local_b8) {
        ppGVar6 = std::
                  vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
                  ::operator[](&local_38,(ulong)local_bc);
        (*ppGVar6)->value = (*ppGVar6)->value + 1.0;
      }
      else if (local_b8 == 0) {
        ppGVar6 = std::
                  vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>
                  ::operator[](&local_38,(ulong)local_bc);
        (*ppGVar6)->value = (*ppGVar6)->value + 0.5;
      }
      local_b1 = '\x03' - local_b1;
    }
    local_c0 = 1;
  }
  std::vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_>::
  ~vector((vector<mcts::GameData<uttt::IBoard>_*,_std::allocator<mcts::GameData<uttt::IBoard>_*>_> *
          )CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
  return;
}

Assistant:

static void
MCTS_cache_(std::unordered_set<GameData<IGame> *, GameDataHash<IGame>, GameDataEqual<IGame>> &cache, GameData<IGame> *root_game_data)
{
    game::IPlayer player_to_move = root_game_data->game.GetPlayerToMove();
    auto node = root_game_data;
    std::vector<GameData<IGame> *> nodes = {node};
    while (!node->children.empty())
    {
        GameData<IGame> *child = nullptr;
        double min = 0.0;
        for (auto it : node->children)
        {
            auto n = it.second;
            double p = static_cast<double>(n->value) / n->total + std::sqrt(2.0 * std::log(node->total) / n->total);
            if (p > min || child == nullptr)
            {
                min = p;
                child = it.second;
            }
        }
        node = child;
        nodes.push_back(node);
    }

    game::IPlayer player = player_to_move;
    int status = node->game.GetStatus();
    if (status != game::Undecided)
    {
        ++nodes[0]->total;
        for (unsigned i = 1; i < nodes.size(); ++i, player = 3 - player)
        {
            ++nodes[i]->total;
            if (player == status)
                nodes[i]->value += 1.0;
            else if (status == game::Draw)
                nodes[i]->value += 0.5;
        }
        return;
    }

    auto moves = node->game.GetPossibleMoves();
    std::unordered_map<GameData<IGame> *, game::IMove, GameDataHash<IGame>, GameDataEqual<IGame>> positions;
    for (auto m : moves)
    {
        auto new_game_data = new GameData<IGame>(node->game);
        new_game_data->game.ApplyMove(m);
        if (positions.find(new_game_data) != positions.end())
        {
            delete new_game_data;
            continue;
        }
        positions[new_game_data] = m;
    }
    for (auto p : positions)
    {
        GameData<IGame> *new_node = nullptr;
        auto it = cache.find(p.first);
        if (it == cache.end())
        {
            new_node = p.first;
            cache.insert(new_node);
        }
        else
        {
            new_node = *it;
            delete p.first;
        }

        node->children.emplace_back(p.second, new_node);

        nodes.push_back(new_node);

        int status = RandomPlayout()(new_node->game);

        player = player_to_move;
        ++nodes[0]->total;
        for (unsigned i = 1; i < nodes.size(); ++i, player = 3 - player)
        {
            ++nodes[i]->total;
            if (player == status)
                nodes[i]->value += 1.0;
            else if (status == game::Draw)
                nodes[i]->value += 0.5;
        }

        nodes.pop_back();
    }
}